

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void capnp::compiler::findImports
               (Reader exp,
               set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *output)

{
  uint *puVar1;
  Reader exp_00;
  Reader exp_01;
  Reader exp_02;
  Reader exp_03;
  Reader exp_04;
  set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *this;
  bool bVar2;
  Which WVar3;
  Iterator IVar4;
  Iterator IVar5;
  Reader local_3a8;
  Reader local_378;
  Reader local_348;
  undefined1 local_318 [8];
  Reader param;
  undefined1 local_2d8 [8];
  Iterator __end3_2;
  undefined1 local_2b8 [8];
  Iterator __begin3_2;
  Reader *__range3_2;
  CapTableReader *pCStack_268;
  void *local_260;
  WirePointer *pWStack_258;
  StructDataBitCount local_250;
  StructPointerCount SStack_24c;
  undefined2 uStack_24a;
  int iStack_248;
  undefined4 uStack_244;
  undefined1 local_240 [8];
  Reader app;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [8];
  Reader element_1;
  undefined1 local_1a0 [8];
  Iterator __end3_1;
  undefined1 local_180 [8];
  Iterator __begin3_1;
  Reader *__range3_1;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 local_108 [8];
  Reader element;
  undefined1 local_c8 [8];
  Iterator __end3;
  undefined1 local_a8 [8];
  Iterator __begin3;
  Reader *__range3;
  Reader local_50;
  StringPtr local_20;
  set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *local_10;
  set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *output_local;
  
  local_10 = output;
  WVar3 = Expression::Reader::which(&exp);
  this = local_10;
  switch(WVar3) {
  case UNKNOWN:
  case POSITIVE_INT:
  case NEGATIVE_INT:
  case FLOAT:
  case STRING:
  case RELATIVE_NAME:
  case BINARY:
  case ABSOLUTE_NAME:
  case EMBED:
    break;
  case LIST:
    puVar1 = &__begin3.index;
    Expression::Reader::getList((Reader *)puVar1,&exp);
    IVar4 = List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader::begin((Reader *)puVar1);
    __end3._8_8_ = IVar4.container;
    __begin3.container._0_4_ = IVar4.index;
    local_a8 = (undefined1  [8])__end3._8_8_;
    IVar4 = List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader::end((Reader *)puVar1);
    element._reader._40_8_ = IVar4.container;
    __end3.container._0_4_ = IVar4.index;
    local_c8 = (undefined1  [8])element._reader._40_8_;
    while (bVar2 = capnp::_::
                   IndexingIterator<const_capnp::List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Reader>
                   ::operator!=((IndexingIterator<const_capnp::List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Reader>
                                 *)local_a8,
                                (IndexingIterator<const_capnp::List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Reader>
                                 *)local_c8), bVar2) {
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Reader>
      ::operator*((Reader *)local_108,
                  (IndexingIterator<const_capnp::List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Reader>
                   *)local_a8);
      memcpy(&__range3_1,local_108,0x30);
      exp_00._reader.capTable = (CapTableReader *)uStack_130;
      exp_00._reader.segment = (SegmentReader *)__range3_1;
      exp_00._reader.data = (void *)local_128;
      exp_00._reader.pointers = (WirePointer *)uStack_120;
      exp_00._reader.dataSize = (undefined4)local_118;
      exp_00._reader.pointerCount = local_118._4_2_;
      exp_00._reader._38_2_ = local_118._6_2_;
      exp_00._reader._40_8_ = uStack_110;
      findImports(exp_00,local_10);
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Reader>
      ::operator++((IndexingIterator<const_capnp::List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Reader>
                    *)local_a8);
    }
    break;
  case TUPLE:
    puVar1 = &__begin3_1.index;
    Expression::Reader::getTuple((Reader *)puVar1,&exp);
    IVar5 = List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader::begin
                      ((Reader *)puVar1);
    __end3_1._8_8_ = IVar5.container;
    __begin3_1.container._0_4_ = IVar5.index;
    local_180 = (undefined1  [8])__end3_1._8_8_;
    IVar5 = List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader::end((Reader *)puVar1);
    element_1._reader._40_8_ = IVar5.container;
    __end3_1.container._0_4_ = IVar5.index;
    local_1a0 = (undefined1  [8])element_1._reader._40_8_;
    while (bVar2 = capnp::_::
                   IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                   ::operator!=((IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                                 *)local_180,
                                (IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                                 *)local_1a0), bVar2) {
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
      ::operator*((Reader *)local_1e0,
                  (IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                   *)local_180);
      Expression::Param::Reader::getValue((Reader *)&app._reader.nestingLimit,(Reader *)local_1e0);
      exp_01._reader.capTable = (CapTableReader *)uStack_208;
      exp_01._reader.segment = (SegmentReader *)app._reader._40_8_;
      exp_01._reader.data = (void *)local_200;
      exp_01._reader.pointers = (WirePointer *)uStack_1f8;
      exp_01._reader._32_8_ = local_1f0;
      exp_01._reader._40_8_ = uStack_1e8;
      findImports(exp_01,local_10);
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
      ::operator++((IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                    *)local_180);
    }
    break;
  case APPLICATION:
    Expression::Reader::getApplication((Reader *)local_240,&exp);
    Expression::Application::Reader::getFunction((Reader *)&__range3_2,(Reader *)local_240);
    exp_02._reader.capTable = pCStack_268;
    exp_02._reader.segment = (SegmentReader *)__range3_2;
    exp_02._reader.data = local_260;
    exp_02._reader.pointers = pWStack_258;
    exp_02._reader.dataSize = local_250;
    exp_02._reader.pointerCount = SStack_24c;
    exp_02._reader._38_2_ = uStack_24a;
    exp_02._reader.nestingLimit = iStack_248;
    exp_02._reader._44_4_ = uStack_244;
    findImports(exp_02,local_10);
    puVar1 = &__begin3_2.index;
    Expression::Application::Reader::getParams((Reader *)puVar1,(Reader *)local_240);
    IVar5 = List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader::begin
                      ((Reader *)puVar1);
    __end3_2._8_8_ = IVar5.container;
    __begin3_2.container._0_4_ = IVar5.index;
    local_2b8 = (undefined1  [8])__end3_2._8_8_;
    IVar5 = List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader::end((Reader *)puVar1);
    param._reader._40_8_ = IVar5.container;
    __end3_2.container._0_4_ = IVar5.index;
    local_2d8 = (undefined1  [8])param._reader._40_8_;
    while (bVar2 = capnp::_::
                   IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                   ::operator!=((IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                                 *)local_2b8,
                                (IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                                 *)local_2d8), bVar2) {
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
      ::operator*((Reader *)local_318,
                  (IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                   *)local_2b8);
      Expression::Param::Reader::getValue(&local_348,(Reader *)local_318);
      exp_03._reader.capTable = local_348._reader.capTable;
      exp_03._reader.segment = local_348._reader.segment;
      exp_03._reader.data = local_348._reader.data;
      exp_03._reader.pointers = local_348._reader.pointers;
      exp_03._reader.dataSize = local_348._reader.dataSize;
      exp_03._reader.pointerCount = local_348._reader.pointerCount;
      exp_03._reader._38_2_ = local_348._reader._38_2_;
      exp_03._reader.nestingLimit = local_348._reader.nestingLimit;
      exp_03._reader._44_4_ = local_348._reader._44_4_;
      findImports(exp_03,local_10);
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
      ::operator++((IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
                    *)local_2b8);
    }
    break;
  case MEMBER:
    Expression::Reader::getMember(&local_3a8,&exp);
    Expression::Member::Reader::getParent(&local_378,&local_3a8);
    exp_04._reader.capTable = local_378._reader.capTable;
    exp_04._reader.segment = local_378._reader.segment;
    exp_04._reader.data = local_378._reader.data;
    exp_04._reader.pointers = local_378._reader.pointers;
    exp_04._reader.dataSize = local_378._reader.dataSize;
    exp_04._reader.pointerCount = local_378._reader.pointerCount;
    exp_04._reader._38_2_ = local_378._reader._38_2_;
    exp_04._reader.nestingLimit = local_378._reader.nestingLimit;
    exp_04._reader._44_4_ = local_378._reader._44_4_;
    findImports(exp_04,local_10);
    break;
  case IMPORT:
    Expression::Reader::getImport(&local_50,&exp);
    local_20.content = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_50);
    std::set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>::insert
              (this,&local_20);
  }
  return;
}

Assistant:

static void findImports(Expression::Reader exp, std::set<kj::StringPtr>& output) {
  switch (exp.which()) {
    case Expression::UNKNOWN:
    case Expression::POSITIVE_INT:
    case Expression::NEGATIVE_INT:
    case Expression::FLOAT:
    case Expression::STRING:
    case Expression::BINARY:
    case Expression::RELATIVE_NAME:
    case Expression::ABSOLUTE_NAME:
    case Expression::EMBED:
      break;

    case Expression::IMPORT:
      output.insert(exp.getImport().getValue());
      break;

    case Expression::LIST:
      for (auto element: exp.getList()) {
        findImports(element, output);
      }
      break;

    case Expression::TUPLE:
      for (auto element: exp.getTuple()) {
        findImports(element.getValue(), output);
      }
      break;

    case Expression::APPLICATION: {
      auto app = exp.getApplication();
      findImports(app.getFunction(), output);
      for (auto param: app.getParams()) {
        findImports(param.getValue(), output);
      }
      break;
    }

    case Expression::MEMBER: {
      findImports(exp.getMember().getParent(), output);
      break;
    }
  }
}